

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O0

void __thiscall
QuasispeciesEdgeCalculator::QuasispeciesEdgeCalculator
          (QuasispeciesEdgeCalculator *this,double Q,double edge_quasi_cutoff,double overlap,
          bool frameshift_merge,
          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *simpson_map,double edge_quasi_cutoff_single,double overlap_single,
          double edge_quasi_cutoff_mixed)

{
  undefined1 in_SIL;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *in_RDI;
  _Base_ptr in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  size_t in_XMM3_Qa;
  _Base_ptr in_XMM4_Qa;
  _Base_ptr in_XMM5_Qa;
  _Base_ptr *this_00;
  
  EdgeCalculator::EdgeCalculator((EdgeCalculator *)in_RDI);
  *(undefined ***)&(in_RDI->_M_t)._M_impl = &PTR__QuasispeciesEdgeCalculator_00352d20;
  this_00 = &in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::map
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             0x2607e5);
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = in_XMM0_Qa;
  *(undefined8 *)&in_RDI[1]._M_t._M_impl = in_XMM1_Qa;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = in_XMM3_Qa;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = in_XMM5_Qa;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = in_XMM2_Qa;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = in_XMM4_Qa;
  *(undefined1 *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       in_SIL & _S_black;
  std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::operator=
            ((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *)
             this_00,in_RDI);
  return;
}

Assistant:

QuasispeciesEdgeCalculator::QuasispeciesEdgeCalculator(double Q, double edge_quasi_cutoff, double overlap, bool frameshift_merge, map<int, double>& simpson_map, double edge_quasi_cutoff_single, double overlap_single, double edge_quasi_cutoff_mixed) {
    this->Q = Q;
    this->EDGE_QUASI_CUTOFF = edge_quasi_cutoff;
    this->EDGE_QUASI_CUTOFF_SINGLE = edge_quasi_cutoff_single;
    this->EDGE_QUASI_CUTOFF_MIXED = edge_quasi_cutoff_mixed;
    this->MIN_OVERLAP_CLIQUES = overlap;
    this->MIN_OVERLAP_SINGLE = overlap_single;
    this->FRAMESHIFT_MERGE = frameshift_merge;
    this->SIMPSON_MAP = simpson_map;
}